

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O1

void __thiscall OpenMD::Rattle::doConstraint(Rattle *this,ConstraintPairFuncPtr func)

{
  pointer ppCVar1;
  pointer ppCVar2;
  element_type *peVar3;
  int iVar4;
  Molecule *pMVar5;
  code *pcVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  long in_RDX;
  ConstraintPair *pCVar9;
  ConstraintElem *pCVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  MoleculeIterator mi;
  MoleculeIterator local_50;
  int local_44;
  ulong local_40;
  Rattle *local_38;
  
  if (this->doRattle_ == true) {
    local_50._M_node = (_Base_ptr)0x0;
    pMVar5 = SimInfo::beginMolecule(this->info_,&local_50);
    if (pMVar5 != (Molecule *)0x0) {
      do {
        ppCVar7 = (pMVar5->constraintElems_).
                  super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar1 = (pMVar5->constraintElems_).
                  super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar7 == ppCVar1) {
          pCVar10 = (ConstraintElem *)0x0;
        }
        else {
          pCVar10 = *ppCVar7;
        }
        while (pCVar10 != (ConstraintElem *)0x0) {
          ppCVar7 = ppCVar7 + 1;
          ((pCVar10->moved_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          data_ = true;
          ((pCVar10->moving_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          data_ = false;
          if (ppCVar7 == ppCVar1) {
            pCVar10 = (ConstraintElem *)0x0;
          }
          else {
            pCVar10 = *ppCVar7;
          }
        }
        ppCVar8 = (pMVar5->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar2 = (pMVar5->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar8 == ppCVar2) {
          pCVar9 = (ConstraintPair *)0x0;
        }
        else {
          pCVar9 = *ppCVar8;
        }
        while (pCVar9 != (ConstraintPair *)0x0) {
          ppCVar8 = ppCVar8 + 1;
          pCVar9->force_ = 0.0;
          if (ppCVar8 == ppCVar2) {
            pCVar9 = (ConstraintPair *)0x0;
          }
          else {
            pCVar9 = *ppCVar8;
          }
        }
        pMVar5 = SimInfo::nextMolecule(this->info_,&local_50);
      } while (pMVar5 != (Molecule *)0x0);
    }
    if (this->maxConsIteration_ < 1) {
      bVar14 = true;
      uVar13 = 0;
    }
    else {
      plVar11 = (long *)((long)&this->info_ + in_RDX);
      uVar13 = 0;
      local_38 = this;
      do {
        pMVar5 = SimInfo::beginMolecule(this->info_,&local_50);
        if (pMVar5 == (Molecule *)0x0) {
          bVar14 = false;
        }
        else {
          local_44 = 1;
          local_40 = uVar13;
          do {
            ppCVar8 = (pMVar5->constraintPairs_).
                      super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            this = local_38;
            if (ppCVar8 ==
                (pMVar5->constraintPairs_).
                super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pCVar9 = (ConstraintPair *)0x0;
            }
            else {
              pCVar9 = *ppCVar8;
            }
            while (local_38 = this, pCVar9 != (ConstraintPair *)0x0) {
              ppCVar8 = ppCVar8 + 1;
              if ((((pCVar9->consElem1_->moved_).
                    super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->data_ != false) ||
                 (((pCVar9->consElem2_->moved_).
                   super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->data_ == true)) {
                pcVar6 = (code *)func;
                if ((func & 1) != 0) {
                  pcVar6 = *(code **)(*plVar11 + -1 + func);
                }
                iVar4 = (*pcVar6)(plVar11,pCVar9);
                if (iVar4 != 1) {
                  if (iVar4 == 0) {
                    ((pCVar9->consElem1_->moving_).
                     super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->data_ = true;
                    ((pCVar9->consElem2_->moving_).
                     super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->data_ = true;
                    local_44 = 0;
                  }
                  else {
                    if (iVar4 == -1) {
                      builtin_strncpy(painCave.errMsg + 0x33,"t Fail\n",8);
                      builtin_strncpy(painCave.errMsg + 0x20,"nstrainA, Constrain",0x13);
                      builtin_strncpy(painCave.errMsg + 0x10,"re in Rattle::co",0x10);
                      painCave.errMsg[8] = 'n';
                      painCave.errMsg[9] = 't';
                      painCave.errMsg[10] = ' ';
                      painCave.errMsg[0xb] = 'f';
                      painCave.errMsg[0xc] = 'a';
                      painCave.errMsg[0xd] = 'i';
                      painCave.errMsg[0xe] = 'l';
                      painCave.errMsg[0xf] = 'u';
                    }
                    else {
                      builtin_strncpy(painCave.errMsg + 0x33,"ized status",0xc);
                      builtin_strncpy(painCave.errMsg + 0x20,"t() Error: unrecogn",0x13);
                      builtin_strncpy(painCave.errMsg + 0x10,"thm::doConstrain",0x10);
                      painCave.errMsg[8] = 'n';
                      painCave.errMsg[9] = 't';
                      painCave.errMsg[10] = 'A';
                      painCave.errMsg[0xb] = 'l';
                      painCave.errMsg[0xc] = 'g';
                      painCave.errMsg[0xd] = 'o';
                      painCave.errMsg[0xe] = 'r';
                      painCave.errMsg[0xf] = 'i';
                    }
                    builtin_strncpy(painCave.errMsg,"Constrai",8);
                    painCave.isFatal = 1;
                    simError();
                  }
                }
              }
              this = local_38;
              if (ppCVar8 ==
                  (pMVar5->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pCVar9 = (ConstraintPair *)0x0;
              }
              else {
                pCVar9 = *ppCVar8;
              }
            }
            pMVar5 = SimInfo::nextMolecule(this->info_,&local_50);
          } while (pMVar5 != (Molecule *)0x0);
          bVar14 = local_44 == 0;
          uVar13 = local_40;
        }
        errorCheckPoint();
        pMVar5 = SimInfo::beginMolecule(this->info_,&local_50);
        while (pMVar5 != (Molecule *)0x0) {
          ppCVar7 = (pMVar5->constraintElems_).
                    super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppCVar1 = (pMVar5->constraintElems_).
                    super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppCVar7 == ppCVar1) {
            pCVar10 = (ConstraintElem *)0x0;
          }
          else {
            pCVar10 = *ppCVar7;
          }
          while (pCVar10 != (ConstraintElem *)0x0) {
            ppCVar7 = ppCVar7 + 1;
            peVar3 = (pCVar10->moving_).
                     super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            ((pCVar10->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            data_ = peVar3->data_;
            peVar3->data_ = false;
            if (ppCVar7 == ppCVar1) {
              pCVar10 = (ConstraintElem *)0x0;
            }
            else {
              pCVar10 = *ppCVar7;
            }
          }
          pMVar5 = SimInfo::nextMolecule(this->info_,&local_50);
        }
        uVar12 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar12;
      } while ((bool)(bVar14 & (int)uVar12 < this->maxConsIteration_));
    }
    if (bVar14) {
      snprintf(painCave.errMsg,2000,
               "Constraint failure in Rattle::constrainA, too many iterations: %d\n",uVar13);
      painCave.isFatal = 1;
      simError();
    }
    errorCheckPoint();
  }
  return;
}

Assistant:

void Rattle::doConstraint(ConstraintPairFuncPtr func) {
    if (!doRattle_) return;

    Molecule* mol;
    SimInfo::MoleculeIterator mi;
    ConstraintElem* consElem;
    Molecule::ConstraintElemIterator cei;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
           consElem = mol->nextConstraintElem(cei)) {
        consElem->setMoved(true);
        consElem->setMoving(false);
      }
      for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
           consPair = mol->nextConstraintPair(cpi)) {
        consPair->resetConstraintForce();
      }
    }

    // main loop of constraint algorithm
    int done      = 0;
    int iteration = 0;
    while (!done && iteration < maxConsIteration_) {
      done = 1;

      // loop over every constraint pair

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          // dispatch constraint algorithm
          if (consPair->isMoved()) {
            int exeStatus = (this->*func)(consPair);

            switch (exeStatus) {
            case consFail:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "Constraint failure in Rattle::constrainA, "
                       "Constraint Fail\n");
              painCave.isFatal = 1;
              simError();

              break;
            case consSuccess:
              // constrain the pair by moving two elements
              done = 0;
              consPair->getConsElem1()->setMoving(true);
              consPair->getConsElem2()->setMoving(true);
              break;
            case consAlready:
              // current pair is already constrained, do not need to
              // move the elements
              break;
            default:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ConstraintAlgorithm::doConstraint() "
                       "Error: unrecognized status");
              painCave.isFatal = 1;
              simError();
              break;
            }
          }
        }
      }  // end for(iter->first())

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &done, 1, MPI_INT, MPI_LAND, MPI_COMM_WORLD);
#endif

      errorCheckPoint();

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
             consElem = mol->nextConstraintElem(cei)) {
          consElem->setMoved(consElem->getMoving());
          consElem->setMoving(false);
        }
      }
      iteration++;
    }  // end while

    if (!done) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Constraint failure in Rattle::constrainA, "
               "too many iterations: %d\n",
               iteration);
      painCave.isFatal = 1;
      simError();
    }

    errorCheckPoint();
  }